

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O1

void __thiscall google::protobuf::DynamicMessage::~DynamicMessage(DynamicMessage *this)

{
  FieldDescriptor *field;
  Descriptor *pDVar1;
  long lVar2;
  once_flag *poVar3;
  bool bVar4;
  DynamicMessage *pDVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  long *plVar9;
  undefined8 *puVar10;
  RepeatedField<int> *this_00;
  long lVar11;
  long lVar12;
  _func_void_FieldDescriptor_ptr *local_40;
  FieldDescriptor *local_38;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__DynamicMessage_003c6910;
  pDVar1 = this->type_info_->type;
  internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  lVar8 = (long)this->type_info_->extensions_offset;
  if (lVar8 != -1) {
    internal::ExtensionSet::~ExtensionSet
              ((ExtensionSet *)
               ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite + lVar8));
  }
  uVar6 = (ulong)*(uint *)(pDVar1 + 0x68);
  if (0 < (int)*(uint *)(pDVar1 + 0x68)) {
    lVar12 = 0;
    lVar8 = 0;
    do {
      lVar2 = *(long *)(pDVar1 + 0x28);
      field = (FieldDescriptor *)(lVar2 + lVar12);
      lVar11 = *(long *)(lVar2 + 0x58 + lVar12);
      if ((lVar11 == 0) ||
         ((*(int *)(lVar11 + 0x18) == 1 && (*(char *)(**(long **)(lVar11 + 0x20) + 0x41) != '\0'))))
      {
        this_00 = (RepeatedField<int> *)
                  ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
                  (long)(int)(this->type_info_->offsets)._M_t.
                             super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                             .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl[lVar8]);
        poVar3 = *(once_flag **)(lVar2 + 0x30 + lVar12);
        if (*(int *)(lVar2 + 0x3c + lVar12) == 3) {
          if (poVar3 != (once_flag *)0x0) {
            local_40 = FieldDescriptor::TypeOnceInit;
            local_38 = field;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (poVar3,&local_40,&local_38);
          }
          switch(*(undefined4 *)
                  (FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(lVar2 + 0x38 + lVar12) * 4)
                ) {
          case 1:
          case 8:
            RepeatedField<int>::~RepeatedField(this_00);
            break;
          case 2:
            RepeatedField<long>::~RepeatedField((RepeatedField<long> *)this_00);
            break;
          case 3:
            RepeatedField<unsigned_int>::~RepeatedField((RepeatedField<unsigned_int> *)this_00);
            break;
          case 4:
            RepeatedField<unsigned_long>::~RepeatedField((RepeatedField<unsigned_long> *)this_00);
            break;
          case 5:
            RepeatedField<double>::~RepeatedField((RepeatedField<double> *)this_00);
            break;
          case 6:
            RepeatedField<float>::~RepeatedField((RepeatedField<float> *)this_00);
            break;
          case 7:
            RepeatedField<bool>::~RepeatedField((RepeatedField<bool> *)this_00);
            break;
          case 9:
            RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)this_00);
            break;
          case 10:
            bVar4 = anon_unknown_0::IsMapFieldInApi(field);
            if (bVar4) {
              (*(code *)**(undefined8 **)this_00)(this_00);
            }
            else {
              RepeatedPtrField<google::protobuf::Message>::~RepeatedPtrField
                        ((RepeatedPtrField<google::protobuf::Message> *)this_00);
            }
          }
        }
        else {
          if (poVar3 != (once_flag *)0x0) {
            local_40 = FieldDescriptor::TypeOnceInit;
            local_38 = field;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (poVar3,&local_40,&local_38);
          }
          if (*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                      (ulong)*(uint *)(lVar2 + 0x38 + lVar12) * 4) == 9) {
            pDVar5 = this->type_info_->prototype;
            uVar6 = (ulong)(int)(this->type_info_->offsets)._M_t.
                                super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                                .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl[lVar8];
            puVar10 = *(undefined8 **)this_00;
            goto LAB_002b9ad4;
          }
          poVar3 = *(once_flag **)(lVar2 + 0x30 + lVar12);
          if (poVar3 != (once_flag *)0x0) {
            local_40 = FieldDescriptor::TypeOnceInit;
            local_38 = field;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (poVar3,&local_40,&local_38);
          }
          if ((*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                       (ulong)*(uint *)(lVar2 + 0x38 + lVar12) * 4) == 10) &&
             (pDVar5 = this->type_info_->prototype,
             pDVar5 != (DynamicMessage *)0x0 && pDVar5 != this)) {
            plVar9 = *(long **)this_00;
            goto LAB_002b9bab;
          }
        }
      }
      else {
        iVar7 = (int)((ulong)(lVar11 - *(long *)(*(long *)(lVar11 + 0x10) + 0x30)) >> 4);
        if (*(int *)((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
                    (long)(iVar7 * -0x55555554 + this->type_info_->oneof_case_offset)) ==
            *(int *)(lVar2 + 0x44 + lVar12)) {
          lVar11 = (long)(int)(this->type_info_->offsets)._M_t.
                              super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                              .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl
                              [(int)uVar6 + iVar7 * -0x55555555];
          poVar3 = *(once_flag **)(lVar2 + 0x30 + lVar12);
          if (poVar3 != (once_flag *)0x0) {
            local_40 = FieldDescriptor::TypeOnceInit;
            local_38 = field;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (poVar3,&local_40,&local_38);
          }
          if (*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                      (ulong)*(uint *)(lVar2 + 0x38 + lVar12) * 4) == 9) {
            pDVar5 = this->type_info_->prototype;
            uVar6 = (ulong)(this->type_info_->offsets)._M_t.
                           super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                           .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl[lVar8];
            puVar10 = *(undefined8 **)
                       ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite + lVar11);
LAB_002b9ad4:
            if (puVar10 != (undefined8 *)0x0 &&
                puVar10 !=
                *(undefined8 **)
                 ((long)&(pDVar5->super_Message).super_MessageLite._vptr_MessageLite + uVar6)) {
              if ((undefined8 *)*puVar10 != puVar10 + 2) {
                operator_delete((undefined8 *)*puVar10);
              }
              operator_delete(puVar10);
            }
          }
          else {
            poVar3 = *(once_flag **)(lVar2 + 0x30 + lVar12);
            if (poVar3 != (once_flag *)0x0) {
              local_40 = FieldDescriptor::TypeOnceInit;
              local_38 = field;
              std::
              call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                        (poVar3,&local_40,&local_38);
            }
            if (*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                        (ulong)*(uint *)(lVar2 + 0x38 + lVar12) * 4) == 10) {
              plVar9 = *(long **)((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
                                 lVar11);
LAB_002b9bab:
              if (plVar9 != (long *)0x0) {
                (**(code **)(*plVar9 + 8))();
              }
            }
          }
        }
      }
      lVar8 = lVar8 + 1;
      uVar6 = (ulong)*(int *)(pDVar1 + 0x68);
      lVar12 = lVar12 + 0x98;
    } while (lVar8 < (long)uVar6);
  }
  return;
}

Assistant:

DynamicMessage::~DynamicMessage() {
  const Descriptor* descriptor = type_info_->type;

  _internal_metadata_.Delete<UnknownFieldSet>();

  if (type_info_->extensions_offset != -1) {
    reinterpret_cast<ExtensionSet*>(
        OffsetToPointer(type_info_->extensions_offset))
        ->~ExtensionSet();
  }

  // We need to manually run the destructors for repeated fields and strings,
  // just as we ran their constructors in the DynamicMessage constructor.
  // We also need to manually delete oneof fields if it is set and is string
  // or message.
  // Additionally, if any singular embedded messages have been allocated, we
  // need to delete them, UNLESS we are the prototype message of this type,
  // in which case any embedded messages are other prototypes and shouldn't
  // be touched.
  for (int i = 0; i < descriptor->field_count(); i++) {
    const FieldDescriptor* field = descriptor->field(i);
    if (InRealOneof(field)) {
      void* field_ptr =
          OffsetToPointer(type_info_->oneof_case_offset +
                          sizeof(uint32) * field->containing_oneof()->index());
      if (*(reinterpret_cast<const uint32*>(field_ptr)) == field->number()) {
        field_ptr = OffsetToPointer(
            type_info_->offsets[descriptor->field_count() +
                                field->containing_oneof()->index()]);
        if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
          switch (field->options().ctype()) {
            default:
            case FieldOptions::STRING: {
              const std::string* default_value =
                  &(reinterpret_cast<const ArenaStringPtr*>(
                        reinterpret_cast<const uint8*>(type_info_->prototype) +
                        type_info_->offsets[i])
                        ->Get());
              reinterpret_cast<ArenaStringPtr*>(field_ptr)->Destroy(
                  default_value, NULL);
              break;
            }
          }
        } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
            delete *reinterpret_cast<Message**>(field_ptr);
        }
      }
      continue;
    }
    void* field_ptr = OffsetToPointer(type_info_->offsets[i]);

    if (field->is_repeated()) {
      switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                  \
  case FieldDescriptor::CPPTYPE_##UPPERCASE:               \
    reinterpret_cast<RepeatedField<LOWERCASE>*>(field_ptr) \
        ->~RepeatedField<LOWERCASE>();                     \
    break

        HANDLE_TYPE(INT32, int32);
        HANDLE_TYPE(INT64, int64);
        HANDLE_TYPE(UINT32, uint32);
        HANDLE_TYPE(UINT64, uint64);
        HANDLE_TYPE(DOUBLE, double);
        HANDLE_TYPE(FLOAT, float);
        HANDLE_TYPE(BOOL, bool);
        HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

        case FieldDescriptor::CPPTYPE_STRING:
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING:
              reinterpret_cast<RepeatedPtrField<std::string>*>(field_ptr)
                  ->~RepeatedPtrField<std::string>();
              break;
          }
          break;

        case FieldDescriptor::CPPTYPE_MESSAGE:
          if (IsMapFieldInApi(field)) {
            reinterpret_cast<DynamicMapField*>(field_ptr)->~DynamicMapField();
          } else {
            reinterpret_cast<RepeatedPtrField<Message>*>(field_ptr)
                ->~RepeatedPtrField<Message>();
          }
          break;
      }

    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
      switch (field->options().ctype()) {
        default:  // TODO(kenton):  Support other string reps.
        case FieldOptions::STRING: {
          const std::string* default_value =
              &(reinterpret_cast<const ArenaStringPtr*>(
                    type_info_->prototype->OffsetToPointer(
                        type_info_->offsets[i]))
                    ->Get());
          reinterpret_cast<ArenaStringPtr*>(field_ptr)->Destroy(default_value,
                                                                NULL);
          break;
        }
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
          if (!is_prototype()) {
        Message* message = *reinterpret_cast<Message**>(field_ptr);
        if (message != NULL) {
          delete message;
        }
      }
    }
  }
}